

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O2

double __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve
          (BGIP_SolverBruteForceSearch<JointPolicyPureVector> *this)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  element_type *peVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  LIndex LVar14;
  ostream *poVar15;
  EDeadline *this_00;
  undefined8 *puVar16;
  undefined1 *puVar17;
  __time_t extraout_RDX;
  ulong uVar18;
  Index jt;
  ulong uVar19;
  double dVar20;
  double dVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  double dVar24;
  undefined1 auVar25 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  timeval tVar26;
  timeval tVar27;
  double local_2c8;
  double local_2b8;
  ulong local_2b0;
  shared_ptr<JointPolicyPureVector> jpol;
  shared_ptr<JointPolicyPureVector> best;
  double local_260;
  timeval start_time;
  string local_248;
  EDeadline e;
  tms ts_after;
  tms ts_before;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> bgip;
  ostream local_1a8 [376];
  undefined1 extraout_var [56];
  
  this->_m_solved = true;
  iVar8 = gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
  if (iVar8 != 0) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = "Error with gettimeofday";
    __cxa_throw(puVar16,&char_const*::typeinfo,0);
  }
  times((tms *)&ts_before);
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))
            ((shared_ptr<JointPolicyDiscretePure> *)&bgip,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&jpol,(shared_ptr<JointPolicyDiscretePure> *)&bgip);
  boost::detail::shared_count::~shared_count(&bgip.pn);
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))(&bgip,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&best,(shared_ptr<JointPolicyDiscretePure> *)&bgip);
  boost::detail::shared_count::~shared_count(&bgip.pn);
  bgip.px = *(element_type **)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x8;
  bgip.pn.pi_ = *(sp_counted_base **)
                 &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                  super_BGIP_IncrementalSolverInterface.field_0x10;
  if (bgip.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (bgip.pn.pi_)->use_count_ = (bgip.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  uVar11 = BayesianGameBase::GetNrJointTypes();
  boost::detail::shared_count::~shared_count(&bgip.pn);
  lVar3 = *(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                    super_BGIP_IncrementalSolverInterface.field_0x30;
  uVar18 = 0;
  uVar10 = 0;
  puVar1 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
            super_BGIP_IncrementalSolverInterface.field_0x18;
  local_2b0 = 1000000;
  local_2b8 = -1.79769313486232e+308;
  puVar17 = puVar1;
  do {
    if ((uVar10 & 1) != 0) {
      if ((this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
          super_BGIP_IncrementalSolverInterface.field_0xc8 == '\x01') {
        std::endl<char,std::char_traits<char>>
                  (*(ostream **)
                    &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                     super_BGIP_IncrementalSolverInterface.field_0xd0);
        std::endl<char,std::char_traits<char>>
                  (*(ostream **)
                    &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                     super_BGIP_IncrementalSolverInterface.field_0xd8);
      }
      if (lVar3 == 1) {
        BGIPSolution::AddSolution((JointPolicyPureVector *)puVar1,local_2b8);
        local_2c8 = local_2b8;
      }
      else {
        local_2c8 = local_2b8;
      }
      break;
    }
    if ((this->_m_deadlineInSeconds != 0) && (uVar18 % local_2b0 == 0)) {
      times((tms *)&ts_after);
      lVar12 = ts_after.tms_utime - ts_before.tms_utime;
      lVar13 = sysconf(2);
      dVar24 = (double)lVar12 / (double)lVar13;
      if (2.0 <= dVar24) {
        bgip.px = *(element_type **)
                   &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                    super_BGIP_IncrementalSolverInterface.field_0x8;
        bgip.pn.pi_ = *(sp_counted_base **)
                       &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                        super_BGIP_IncrementalSolverInterface.field_0x10;
        if (bgip.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (bgip.pn.pi_)->use_count_ = (bgip.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        LVar14 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)bgip.px);
        boost::detail::shared_count::~shared_count(&bgip.pn);
        dVar20 = (double)Globals::CastLIndexToDouble(LVar14);
        dVar21 = (double)Globals::CastLIndexToDouble(local_2b0);
        dVar20 = (dVar20 / dVar21) * dVar24;
        auVar5._8_8_ = in_XMM2_Qb;
        auVar5._0_8_ = in_XMM2_Qa;
        auVar5 = vcvtusi2sd_avx512f(auVar5,this->_m_deadlineInSeconds);
        if (auVar5._0_8_ * 1.5 < dVar20) {
          std::__cxx11::stringstream::stringstream((stringstream *)&bgip);
          poVar15 = std::operator<<(local_1a8,"BGIP_SolverBruteForceSearch::Solve after ");
          poVar15 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar15);
          std::operator<<(poVar15," we spent ");
          poVar15 = std::ostream::_M_insert<double>(dVar24);
          poVar15 = std::operator<<(poVar15,"s, for all ");
          poVar15 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar15);
          std::operator<<(poVar15," jpols we expect to take ");
          poVar15 = std::ostream::_M_insert<double>(dVar20);
          poVar15 = std::operator<<(poVar15,"s, which is above the deadline (>1.5*");
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::operator<<(poVar15,"s), bailing out");
          std::__cxx11::stringbuf::str();
          EDeadline::EDeadline(&e,&local_248,dVar20);
          std::__cxx11::string::~string((string *)&local_248);
          this_00 = (EDeadline *)__cxa_allocate_exception(0x30);
          EDeadline::EDeadline(this_00,&e);
          __cxa_throw(this_00,&EDeadline::typeinfo,E::~E);
        }
      }
      else {
        local_2b0 = local_2b0 * 2;
      }
    }
    peVar7 = jpol.px;
    peVar4 = *(element_type **)
              &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
               super_BGIP_IncrementalSolverInterface.field_0x8;
    bgip.pn.pi_ = *(sp_counted_base **)
                   &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                    super_BGIP_IncrementalSolverInterface.field_0x10;
    if (bgip.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (bgip.pn.pi_)->use_count_ = (bgip.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    uVar18 = uVar18 + 1;
    uVar19 = 0;
    local_2c8 = 0.0;
    bgip.px = peVar4;
    while (uVar19 < uVar11) {
      uVar22 = (**(code **)(*(long *)peVar4 + 0x68))(peVar4,uVar19);
      uVar9 = (**(code **)(*(long *)peVar7 + 0x88))(peVar7,uVar19);
      puVar17 = *(undefined1 **)peVar4;
      auVar23._0_8_ = (**(code **)(puVar17 + 0x80))(peVar4,uVar19,uVar9);
      auVar23._8_56_ = extraout_var;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_2c8;
      uVar19 = (ulong)((int)uVar19 + 1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar22;
      auVar5 = vfmadd231sd_fma(auVar25,auVar23._0_16_,auVar2);
      local_2c8 = auVar5._0_8_;
    }
    if (local_2b8 < local_2c8) {
      JointPolicyPureVector::operator=(best.px,(JointPolicyPureVector *)jpol.px);
      local_2b8 = local_2c8;
      if ((this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
          super_BGIP_IncrementalSolverInterface.field_0xc8 == '\x01') {
        tVar26.tv_usec = start_time.tv_usec;
        tVar26.tv_sec = start_time.tv_sec;
        tVar27.tv_usec = (__suseconds_t)puVar17;
        tVar27.tv_sec = extraout_RDX;
        dVar24 = (double)TimeTools::GetDeltaTimeDouble(tVar26,tVar27);
        poVar15 = std::ostream::_M_insert<double>(local_2c8);
        std::operator<<(poVar15,"\t");
        poVar15 = std::ostream::_M_insert<double>(dVar24);
        std::operator<<(poVar15,"\t");
      }
    }
    if (lVar3 == 0) {
LAB_0011d0fb:
      uVar10 = JPolComponent_VectorImplementation::Increment();
      bVar6 = true;
    }
    else {
      if (lVar3 != 1) {
        BGIPSolution::AddSolution((JointPolicyPureVector *)puVar1,local_2c8);
        goto LAB_0011d0fb;
      }
      if (local_2c8 < this->_m_CBGupperBound + -1e-12) goto LAB_0011d0fb;
      poVar15 = std::operator<<((ostream *)&std::cout,"Hit CBG upperbound");
      std::endl<char,std::char_traits<char>>(poVar15);
      BGIPSolution::AddSolution((JointPolicyPureVector *)puVar1,local_2c8);
      uVar10 = 0;
      bVar6 = false;
      local_260 = local_2c8;
    }
    boost::detail::shared_count::~shared_count(&bgip.pn);
    local_2c8 = local_260;
  } while (bVar6);
  boost::detail::shared_count::~shared_count(&best.pn);
  boost::detail::shared_count::~shared_count(&jpol.pn);
  return local_2c8;
}

Assistant:

double Solve()
    {    
        _m_solved = true;
        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        tms ts_before, ts_after;
        times(&ts_before);
        LIndex checkPointForDeadline = 1000000;

        bool round = false;

        boost::shared_ptr<JP> jpol = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());
        boost::shared_ptr<JP> best = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());

        double v_best = -DBL_MAX;
        double v = 0.0;

        int i = 0;
        if(DEBUG_BGIP_SOLVER_BFS)
            std::cout<<"Starting Bruteforce search - v_best is init to "<<v_best<<std::endl;
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
        LIndex nrJPols = this->GetBGIPI()->GetNrJointPolicies();
#endif

        size_t nrJT = this->GetBGIPI()->
            GetNrJointTypes();
        size_t nrDesiredSolutions = this->GetNrDesiredSolutions();
        
        while(!round)
        {
            if(DEBUG_BGIP_SOLVER_BFS){std::cout << "Jpol#"<< i << " - ";}
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
            if(i % 1000 == 0&& i > 1000)
            {
                std::cout << "Jpol #"<< i << " of " << nrJPols<< " - ";
                printf("%.4f", ((double)i / nrJPols) * 100 );
                std::cout << "%" << std::endl;
            }
#endif
            //this checks whether BFS has used more time then allowed 
            //(the deadline) and throws an exception if it has.
            if(_m_deadlineInSeconds && (i % checkPointForDeadline) == 0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS = static_cast<double>(utime) / sysconf(_SC_CLK_TCK);

                // we don't want to base our estimate on too few
                // time, so make it run at least 2s
                if(timeSpentInS < 2)
                    checkPointForDeadline *= 2;
                else
                {
                    LIndex nrJPols = this->
                        GetBGIPI()->GetNrJointPolicies();
                    double expectedTimeNeeded=
                        (CastLIndexToDouble(nrJPols)/
                         CastLIndexToDouble(checkPointForDeadline))*
                        timeSpentInS;
                    if(expectedTimeNeeded > (1.5*_m_deadlineInSeconds))
                    {
                        std::stringstream ss;
                        ss << "BGIP_SolverBruteForceSearch::Solve after " 
                           << checkPointForDeadline
                           << " we spent " << timeSpentInS << "s, for all " << nrJPols
                           << " jpols we expect to take " << expectedTimeNeeded
                           << "s, which is above the deadline (>1.5*" 
                           << _m_deadlineInSeconds << "s), bailing out";
                        EDeadline e(ss.str(),expectedTimeNeeded);
                        throw(e);
                    }
                }
            }
            ++i;
            
            v = 0.0;

            JP *jpolRawPtr = jpol.get();
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> 
                bgip= this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface *bgipRawPtr=
                bgip.get();
            for(Index jt = 0; jt < nrJT; ++jt)
            {
                double P_jt = bgipRawPtr->GetProbability(jt);
                Index ja = jpolRawPtr->GetJointActionIndex(jt);  
                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
            }

            if(DEBUG_BGIP_SOLVER_BFS) std::cout << "Expected value = "<< v;
            if(v > v_best)
            {
                if(DEBUG_BGIP_SOLVER_BFS) std::cout << " -> new best policy!!!";
                v_best = v;
                *best = *jpol; 
                if(this->GetWriteAnyTimeResults()){
                    double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);
                    (*this->GetResultsOFStream()) << v_best << "\t";
                    (*this->GetTimingsOFStream()) << delta << "\t";
                }
            }

            if(nrDesiredSolutions == 1 &&
               (v >= (_m_CBGupperBound-PROB_PRECISION)))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                this->AddSolution( *jpol, v );
                return(v);
                break;
            }

            // if we want more than just the single best solution, try to add all to the solution
            if(nrDesiredSolutions>1)
            {
                this->AddSolution( *jpol, v );
//                      std::cout << "added solution with value " << v << ", best is "
//                                << this->GetPayoff() << std::endl;
//                      std::cout << this->GetSolution().SoftPrint();
            }
            if(DEBUG_BGIP_SOLVER_BFS) {    
                std::cout <<  std::endl << "Incrementing joint policy..."<<std::endl; 
            }    
            round = ++(*jpol);
        }
        //end the line in the results file
        if(this->GetWriteAnyTimeResults()){
            (*this->GetResultsOFStream()) << std::endl;
            (*this->GetTimingsOFStream()) << std::endl;
        } 

        // if _m_nrSolutions>1 then we already added this to the queue
        if(nrDesiredSolutions == 1)
            this->AddSolution( *best, v_best );

        return(v_best);
    }